

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-serialization.cpp
# Opt level: O3

int main(void)

{
  value_type_conflict1 *__val;
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  uint j;
  long lVar4;
  vector<Point,_std::allocator<Point>_> points;
  Point p;
  Vector local_b8;
  value_type local_98;
  BinaryBuffer local_78;
  undefined8 local_70;
  void *pvStack_68;
  undefined8 local_60;
  long lStack_58;
  undefined8 local_50;
  vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> vStack_48;
  
  local_78._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_00107cf8;
  local_70 = 0;
  pvStack_68 = (void *)0x0;
  local_60 = 0;
  lStack_58 = 0;
  local_50 = 0;
  vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Position: ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Point *)0x0;
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Point *)0x0;
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(local_98.coords.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish._4_4_,5);
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x500000005;
  std::vector<Point,std::allocator<Point>>::_M_realloc_insert<Point_const&>
            ((vector<Point,std::allocator<Point>> *)&local_b8,(iterator)0x0,(Point *)&local_98);
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,1);
  if (local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Point,std::allocator<Point>>::_M_realloc_insert<Point_const&>
              ((vector<Point,std::allocator<Point>> *)&local_b8,
               (iterator)
               local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_finish,(Point *)&local_98);
  }
  else {
    (local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_finish)->coords[2] =
         (int)local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    *(pointer *)
     (local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
     _M_finish)->coords =
         local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(local_98.coords.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish._4_4_,1);
  if (local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Point,std::allocator<Point>>::_M_realloc_insert<Point_const&>
              ((vector<Point,std::allocator<Point>> *)&local_b8,
               (iterator)
               local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_finish,(Point *)&local_98);
  }
  else {
    (local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_finish)->coords[2] = 1;
    *(pointer *)
     (local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
     _M_finish)->coords =
         local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  diy::Serialization<std::vector<Point,_std::allocator<Point>_>_>::save(&local_78,&local_b8);
  if (local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Position: ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0xc);
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 3;
  *local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = 0;
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0;
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 0;
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  std::vector<PointVec,_std::allocator<PointVec>_>::push_back
            ((vector<PointVec,_std::allocator<PointVec>_> *)&local_b8,&local_98);
  *local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = 2;
  std::vector<PointVec,_std::allocator<PointVec>_>::push_back
            ((vector<PointVec,_std::allocator<PointVec>_> *)&local_b8,&local_98);
  local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 2;
  std::vector<PointVec,_std::allocator<PointVec>_>::push_back
            ((vector<PointVec,_std::allocator<PointVec>_> *)&local_b8,&local_98);
  diy::Serialization<std::vector<PointVec,_std::allocator<PointVec>_>_>::save
            (&local_78,(Vector *)&local_b8);
  if (local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<PointVec,_std::allocator<PointVec>_>::~vector
            ((vector<PointVec,_std::allocator<PointVec>_> *)&local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Position: ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_70 = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Position: ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  diy::Serialization<std::vector<Point,_std::allocator<Point>_>_>::load(&local_78,&local_b8);
  if (local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    do {
      lVar4 = 0;
      do {
        poVar1 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3].coords[lVar4]);
        local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,0x20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_98,1);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      uVar3 = (ulong)((int)uVar3 + 1);
      uVar2 = ((long)local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    } while (uVar3 <= uVar2 && uVar2 - uVar3 != 0);
  }
  if (local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Position: ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  diy::Serialization<std::vector<PointVec,_std::allocator<PointVec>_>_>::load
            (&local_78,(Vector *)&local_b8);
  if (local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    do {
      lVar4 = 0;
      do {
        poVar1 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            *(int *)(*(long *)local_b8.
                                              super__Vector_base<Point,_std::allocator<Point>_>.
                                              _M_impl.super__Vector_impl_data._M_start[uVar3 * 2].
                                              coords + lVar4 * 4));
        local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_98.coords.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,0x20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_98,1);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      uVar3 = (ulong)((int)uVar3 + 1);
      uVar2 = ((long)local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar3 <= uVar2 && uVar2 - uVar3 != 0);
  }
  std::vector<PointVec,_std::allocator<PointVec>_>::~vector
            ((vector<PointVec,_std::allocator<PointVec>_> *)&local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Position: ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_78._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_00107cf8;
  std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::~vector(&vStack_48);
  if (pvStack_68 != (void *)0x0) {
    operator_delete(pvStack_68,lStack_58 - (long)pvStack_68);
  }
  return 0;
}

Assistant:

int main()
{
  diy::MemoryBuffer bb;
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<Point>    points;
    Point p; p[0] = p[1] = p[2] = 5;
    points.push_back(p);
    p[0] = 1;
    points.push_back(p);
    p[2] = 1;
    points.push_back(p);

    save(bb, points);
  }
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<PointVec> points;
    PointVec p(3);
    points.push_back(p);
    p[0] = 2;
    points.push_back(p);
    p[2] = 2;
    points.push_back(p);

    save(bb, points);
  }
  std::cout << "Position: " << bb.position << std::endl;

  bb.reset();
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<Point>    points;
    load(bb, points);
    for (unsigned i = 0; i < points.size(); ++i)
    {
      for (unsigned j = 0; j < 3; ++j)
        std::cout << points[i][j] << ' ';
      std::cout << std::endl;
    }
  }
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<PointVec> points;
    load(bb, points);
    for (unsigned i = 0; i < points.size(); ++i)
    {
      for (unsigned j = 0; j < 3; ++j)
        std::cout << points[i][j] << ' ';
      std::cout << std::endl;
    }
  }
  std::cout << "Position: " << bb.position << std::endl;
}